

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview_p.hpp
# Opt level: O0

void __thiscall
QtMWidgets::TableViewCellPrivate::TableViewCellPrivate
          (TableViewCellPrivate *this,TableViewCell *parent)

{
  TableViewCell *parent_local;
  TableViewCellPrivate *this_local;
  
  this->_vptr_TableViewCellPrivate = (_func_int **)&PTR__TableViewCellPrivate_002364b0;
  this->q = parent;
  this->imageLabel = (MinimumSizeLabel *)0x0;
  this->textLabel = (TextLabel *)0x0;
  this->detailedTextLabel = (TextLabel *)0x0;
  this->accessoryWidget = (QWidget *)0x0;
  this->layout = (TableViewCellLayout *)0x0;
  QColor::QColor(&this->highlightColor);
  this->clicked = false;
  this->highlightOnClick = false;
  return;
}

Assistant:

TableViewCellPrivate( TableViewCell * parent )
		:	q( parent )
		,	imageLabel( 0 )
		,	textLabel( 0 )
		,	detailedTextLabel( 0 )
		,	accessoryWidget( 0 )
		,	layout( 0 )
		,	clicked( false )
		,	highlightOnClick( false )
	{
	}